

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_SingleNodeTreeAttemptDeleteAbsent_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_SingleNodeTreeAttemptDeleteAbsent_Test
          (ARTCorrectnessTest_SingleNodeTreeAttemptDeleteAbsent_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, SingleNodeTreeAttemptDeleteAbsent) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(2, unodb::test::test_values[1]);

  unodb::test::must_not_allocate([&verifier] {
    verifier.attempt_remove_missing_keys({1, 3, 0xFF02});
  });

  verifier.check_present_values();
  verifier.check_absent_keys({1, 3, 0xFF02});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({1, 0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}